

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O2

double __thiscall
FIX::double_conversion::Strtod(double_conversion *this,Vector<const_char> buffer,int exponent)

{
  bool bVar1;
  int iVar2;
  double *guess_00;
  DiyFp DVar3;
  Vector<const_char> trimmed_00;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  DiyFp diy_fp;
  double guess;
  int updated_exponent;
  Vector<const_char> trimmed;
  char copy_buffer [780];
  int *in_stack_fffffffffffffc98;
  Double local_360;
  double local_358;
  Vector<const_char> local_34c;
  char local_338 [792];
  
  buffer_00._8_8_ = buffer.start_;
  guess_00 = (double *)((long)&local_34c.start_ + 4);
  local_34c._4_8_ = (double_conversion *)0x0;
  local_34c._12_4_ = 0;
  buffer_00.start_ = (char *)this;
  TrimAndCut(buffer_00,buffer.length_,local_338,(int)guess_00,&local_34c,in_stack_fffffffffffffc98);
  buffer_01.length_ = local_34c._12_4_;
  buffer_01.start_ = (char *)local_34c._4_8_;
  trimmed_00.start_ = (ulong)(uint)local_34c._12_4_;
  trimmed_00.length_ = (int)local_34c.start_;
  trimmed_00._12_4_ = 0;
  bVar1 = ComputeGuess((double_conversion *)local_34c._4_8_,trimmed_00,(int)&local_358,guess_00);
  if (!bVar1) {
    local_360.d64_ = (uint64_t)local_358;
    DVar3 = Double::UpperBoundary(&local_360);
    buffer_01._12_4_ = 0;
    diy_fp._12_4_ = 0;
    diy_fp.f_ = SUB128(DVar3._0_12_,0);
    diy_fp.e_ = SUB124(DVar3._0_12_,8);
    iVar2 = CompareBufferWithDiyFp(buffer_01,(int)local_34c.start_,diy_fp);
    if ((-1 < iVar2) && ((iVar2 != 0 || (((ulong)local_358 & 1) != 0)))) {
      local_358 = Double::NextDouble(&local_360);
    }
  }
  return local_358;
}

Assistant:

double Strtod(Vector<const char> buffer, int exponent) {
  char copy_buffer[kMaxSignificantDecimalDigits];
  Vector<const char> trimmed;
  int updated_exponent;
  TrimAndCut(buffer, exponent, copy_buffer, kMaxSignificantDecimalDigits,
             &trimmed, &updated_exponent);
  exponent = updated_exponent;

  double guess;
  bool is_correct = ComputeGuess(trimmed, exponent, &guess);
  if (is_correct) return guess;

  DiyFp upper_boundary = Double(guess).UpperBoundary();
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return Double(guess).NextDouble();
  } else if ((Double(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return Double(guess).NextDouble();
  }
}